

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O2

void __thiscall ExampleAppLog::Clear(ExampleAppLog *this)

{
  int local_c;
  
  ImVector<char>::clear((ImVector<char> *)this);
  ImVector<int>::clear(&this->LineOffsets);
  local_c = 0;
  ImVector<int>::push_back(&this->LineOffsets,&local_c);
  return;
}

Assistant:

void    Clear()
    {
        Buf.clear();
        LineOffsets.clear();
        LineOffsets.push_back(0);
    }